

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lock.cpp
# Opt level: O1

bool __thiscall Threading::Event::_Set(Event *this,void *arg)

{
  int iVar1;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar1 == 0) {
    this[0x29] = (Event)0x1;
    pthread_cond_broadcast((pthread_cond_t *)(this + 0x30));
    pthread_mutex_unlock((pthread_mutex_t *)this);
  }
  return iVar1 == 0;
}

Assistant:

bool Threading::Event::_Set(void * arg) volatile
{
  #ifndef _POSIX
    unsigned portLONG ulVar = 1;
    portBASE_TYPE result = arg ? xQueueSendFromISR(xQueue, ( void * ) &ulVar, (signed portBASE_TYPE *)arg) : xQueueSend( xQueue, ( void * ) &ulVar, 0);
    // alreday set but not received . the flag is set . No need a new message
    return result == errQUEUE_FULL || result == pdTRUE;
  #else
    bool isOkay = false;
    // Install clean up handlers
    pthread_cleanup_push((PThreadVoid)pthread_mutex_unlock, (void *) &event);
    int retValue = pthread_mutex_lock((HMUTEX*)&event);
    if (retValue == 0)
    {
        state = true;
        pthread_cond_broadcast((pthread_cond_t*)&condition);
        isOkay = true;
    }
    // Unlock the mutex here
    pthread_cleanup_pop(retValue == 0);
    return isOkay;
  #endif
}